

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

void __thiscall cbor_text::cbor_text(cbor_text *this,cbor_text *other)

{
  size_t __n;
  char *__dest;
  
  __n = other->l;
  this->l = __n;
  if (__n == 0) {
    this->v = (char *)0x0;
  }
  else {
    __dest = (char *)operator_new__(__n + 1);
    this->v = __dest;
    memcpy(__dest,other->v,__n);
    __dest[__n] = '\0';
  }
  return;
}

Assistant:

cbor_text::cbor_text(const cbor_text& other)
{
    l = other.l;
    if (l > 0) {
        v = new char[l+1];
        if (v == NULL) {
            l = 0;
        }
        else {
            memcpy(v, other.v, l);
            v[l] = 0;
        }
    }
    else {
        v = NULL;
    }
}